

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int nni_url_to_address(nng_sockaddr *sa,nng_url *url)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_218 [8];
  nni_resolv_item ri;
  char *pcStack_1f0;
  int rv;
  char *h;
  nni_aio aio;
  int af;
  nng_url *url_local;
  nng_sockaddr *sa_local;
  
  pcVar2 = strchr(url->u_scheme,0x34);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strchr(url->u_scheme,0x36);
    if (pcVar2 == (char *)0x0) {
      aio.a_reap_node.rn_next._4_4_ = 0;
    }
    else {
      aio.a_reap_node.rn_next._4_4_ = 4;
    }
  }
  else {
    aio.a_reap_node.rn_next._4_4_ = 3;
  }
  nni_aio_init((nni_aio *)&h,(nni_cb)0x0,(void *)0x0);
  pcStack_1f0 = url->u_hostname;
  if ((pcStack_1f0 != (char *)0x0) && (iVar1 = strcmp(pcStack_1f0,""), iVar1 == 0)) {
    pcStack_1f0 = (char *)0x0;
  }
  memset(local_218,0,0x20);
  local_218._0_4_ = aio.a_reap_node.rn_next._4_4_;
  local_218[4] = true;
  ri._0_8_ = pcStack_1f0;
  ri.ri_host._0_2_ = (undefined2)url->u_port;
  ri._16_8_ = sa;
  nni_resolv((nni_resolv_item *)local_218,(nni_aio *)&h);
  nni_aio_wait((nni_aio *)&h);
  ri.ri_sa._4_4_ = nni_aio_result((nni_aio *)&h);
  nni_aio_fini((nni_aio *)&h);
  return ri.ri_sa._4_4_;
}

Assistant:

int
nni_url_to_address(nng_sockaddr *sa, const nng_url *url)
{
	int             af;
	nni_aio         aio;
	const char     *h;
	int             rv;
	nni_resolv_item ri;

	// This assumes the scheme is one that uses TCP/IP addresses.

	if (strchr(url->u_scheme, '4') != NULL) {
		af = NNG_AF_INET;
	} else if (strchr(url->u_scheme, '6') != NULL) {
		af = NNG_AF_INET6;
	} else {
		af = NNG_AF_UNSPEC;
	}

	nni_aio_init(&aio, NULL, NULL);

	h = url->u_hostname;
	if ((h != NULL) && (strcmp(h, "") == 0)) {
		h = NULL;
	}

	memset(&ri, 0, sizeof(ri));
	ri.ri_family  = af;
	ri.ri_passive = true;
	ri.ri_host    = h;
	ri.ri_port    = url->u_port;
	ri.ri_sa      = sa;
	nni_resolv(&ri, &aio);
	nni_aio_wait(&aio);
	rv = nni_aio_result(&aio);
	nni_aio_fini(&aio);
	return (rv);
}